

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haptic2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_FONT *font;
  ALLEGRO_EVENT_QUEUE *pAVar2;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  char *format;
  Theme theme;
  Prog prog;
  
  cVar1 = al_install_system(0x85020700,atexit);
  if (cVar1 == '\0') {
    format = "Could not init Allegro\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_install_joystick();
    cVar1 = al_install_haptic();
    if (cVar1 == '\0') {
      format = "Could not init haptics\n";
    }
    else {
      al_init_font_addon();
      al_init_ttf_addon();
      al_set_new_display_flags(0x40);
      display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
      if (display == (ALLEGRO_DISPLAY *)0x0) {
        format = "Unable to create display\n";
      }
      else {
        font = (ALLEGRO_FONT *)al_load_font("data/DejaVuSans.ttf",0xb,0);
        if (font == (ALLEGRO_FONT *)0x0) {
          log_printf("Failed to load data/DejaVuSans.ttf\n");
          font = (ALLEGRO_FONT *)al_create_builtin_font();
          if (font == (ALLEGRO_FONT *)0x0) {
            format = "Could not create builtin font.\n";
            goto LAB_0010b9d7;
          }
        }
        pAVar2 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        if (pAVar2 != (ALLEGRO_EVENT_QUEUE *)0x0) {
          joystick_queue = pAVar2;
          uVar3 = al_get_joystick_event_source();
          al_register_event_source(pAVar2,uVar3);
          get_all_haptics();
          update_timer = (ALLEGRO_TIMER *)al_create_timer(0x3ff0000000000000);
          Theme::Theme(&theme,font);
          Prog::Prog(&prog,&theme,display);
          al_start_timer(update_timer);
          Prog::run(&prog);
          al_destroy_timer(update_timer);
          Prog::~Prog(&prog);
          release_all_haptics();
          al_destroy_event_queue(joystick_queue);
          al_destroy_font(font);
          return 0;
        }
        format = "Could not create joystick event queue font.\n";
        joystick_queue = (ALLEGRO_EVENT_QUEUE *)0x0;
      }
    }
  }
LAB_0010b9d7:
  abort_example(format);
  Prog::~Prog(&prog);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();
   al_install_joystick();
   if (!al_install_haptic()) {
      abort_example("Could not init haptics\n");
   }

   al_init_font_addon();
   al_init_ttf_addon();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Unable to create display\n");
   }

   open_log();

   font = al_load_font("data/DejaVuSans.ttf", 11, 0);
   if (!font) {
      log_printf("Failed to load data/DejaVuSans.ttf\n");
      font = al_create_builtin_font();
      if (!font) {
         abort_example("Could not create builtin font.\n");
      }
   }
   
  
   joystick_queue = al_create_event_queue();
   if (!joystick_queue) {
      abort_example("Could not create joystick event queue font.\n");
   }
   
   al_register_event_source(joystick_queue, al_get_joystick_event_source());
  
   
   get_all_haptics();

   /* Don't remove these braces. */
   {
      /* Set up a timer so the display of playback state is polled regularly. */
      update_timer = al_create_timer(1.0);
      Theme theme(font);
      Prog prog(theme, display);
      al_start_timer(update_timer);
      prog.run();
      al_destroy_timer(update_timer);
   }
   
   release_all_haptics();
   al_destroy_event_queue(joystick_queue); 

   close_log(false);
   
   al_destroy_font(font);

   return 0;
}